

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O2

void xmlDumpEnumeration(xmlBufferPtr buf,xmlEnumerationPtr cur)

{
  while( true ) {
    if (cur == (xmlEnumerationPtr)0x0) {
      return;
    }
    xmlBufferWriteCHAR(buf,cur->name);
    if (cur->next == (_xmlEnumeration *)0x0) break;
    xmlBufferWriteChar(buf," | ");
    cur = cur->next;
  }
  xmlBufferWriteChar(buf,")");
  return;
}

Assistant:

static void
xmlDumpEnumeration(xmlBufferPtr buf, xmlEnumerationPtr cur) {
    if ((buf == NULL) || (cur == NULL))
        return;

    xmlBufferWriteCHAR(buf, cur->name);
    if (cur->next == NULL)
	xmlBufferWriteChar(buf, ")");
    else {
	xmlBufferWriteChar(buf, " | ");
	xmlDumpEnumeration(buf, cur->next);
    }
}